

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctions.cpp
# Opt level: O2

ExpressionValue *
expFuncEndianness(ExpressionValue *__return_storage_ptr__,Identifier *funcName,
                 vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters)

{
  string *this;
  allocator<char> local_a1;
  StringLiteral local_a0;
  string local_80;
  string local_60;
  undefined4 local_40;
  undefined8 local_38;
  undefined1 *local_30;
  undefined8 local_28;
  undefined1 local_20 [16];
  
  local_30 = local_20;
  local_28 = 0;
  local_20[0] = 0;
  local_38 = 0;
  local_40 = 3;
  if (g_fileManager->endianness == Big) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"big",&local_a1);
    StringLiteral::StringLiteral(&local_a0,&local_80);
    ExpressionValue::ExpressionValue(__return_storage_ptr__,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    this = &local_80;
  }
  else {
    if (g_fileManager->endianness != Little) {
      (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
      (__return_storage_ptr__->strValue)._value._M_string_length = 0;
      (__return_storage_ptr__->strValue)._value.field_2._M_local_buf[0] = '\0';
      __return_storage_ptr__->type = Invalid;
      (__return_storage_ptr__->field_1).intValue = 0;
      goto LAB_0012a1a1;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"little",&local_a1);
    StringLiteral::StringLiteral(&local_a0,&local_60);
    ExpressionValue::ExpressionValue(__return_storage_ptr__,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    this = &local_60;
  }
  std::__cxx11::string::~string((string *)this);
LAB_0012a1a1:
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue expFuncEndianness(const Identifier &funcName, const std::vector<ExpressionValue>& parameters)
{
	ExpressionValue result;
	result.type = ExpressionValueType::String;

	switch (g_fileManager->getEndianness())
	{
	case Endianness::Little:
		return ExpressionValue(StringLiteral("little"));
	case Endianness::Big:
		return ExpressionValue(StringLiteral("big"));
	}

	return ExpressionValue();
}